

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

LY_ERR lyxp_vars_set(lyxp_var **vars,char *name,char *value)

{
  lyxp_var *plVar1;
  char *pcVar2;
  bool bVar3;
  LY_ERR LVar4;
  char *pcVar5;
  char *__ptr;
  undefined8 *puVar6;
  lyxp_var *item;
  lyxp_var *local_30;
  
  if (value == (char *)0x0 || (name == (char *)0x0 || vars == (lyxp_var **)0x0)) {
    return LY_EINVAL;
  }
  if ((*vars == (lyxp_var *)0x0) ||
     (LVar4 = lyxp_vars_find((ly_ctx *)0x0,*vars,name,0,&local_30), LVar4 != LY_SUCCESS)) {
    pcVar5 = strdup(name);
    __ptr = strdup(value);
    LVar4 = LY_EMEM;
    if (__ptr != (char *)0x0 && pcVar5 != (char *)0x0) {
      plVar1 = *vars;
      if (plVar1 == (lyxp_var *)0x0) {
        puVar6 = (undefined8 *)malloc(0x18);
        if (puVar6 == (undefined8 *)0x0) goto LAB_00127813;
        *puVar6 = 1;
LAB_00127805:
        *vars = (lyxp_var *)(puVar6 + 1);
        bVar3 = true;
        LVar4 = LY_SUCCESS;
      }
      else {
        pcVar2 = plVar1[-1].value;
        plVar1[-1].value = pcVar2 + 1;
        puVar6 = (undefined8 *)realloc(&plVar1[-1].value,(long)(pcVar2 + 1) * 0x10 | 8);
        if (puVar6 != (undefined8 *)0x0) goto LAB_00127805;
        (*vars)[-1].value = (*vars)[-1].value + -1;
LAB_00127813:
        bVar3 = false;
        LVar4 = LY_EMEM;
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxp_vars_set");
      }
      if (bVar3) {
        plVar1 = *vars;
        pcVar2 = plVar1[-1].value;
        plVar1[(long)(pcVar2 + -1)].name = (char *)0x0;
        plVar1[(long)(pcVar2 + -1)].value = (char *)0x0;
        plVar1[(long)(pcVar2 + -1)].name = pcVar5;
        plVar1[(long)(pcVar2 + -1)].value = __ptr;
        goto LAB_00127867;
      }
    }
    free(pcVar5);
    free(__ptr);
  }
  else {
    pcVar5 = strdup(value);
    if (pcVar5 == (char *)0x0) {
      return LY_EMEM;
    }
    free(local_30->value);
    local_30->value = pcVar5;
LAB_00127867:
    LVar4 = LY_SUCCESS;
  }
  return LVar4;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyxp_vars_set(struct lyxp_var **vars, const char *name, const char *value)
{
    LY_ERR ret = LY_SUCCESS;
    char *var_name = NULL, *var_value = NULL;
    struct lyxp_var *item;

    if (!vars || !name || !value) {
        return LY_EINVAL;
    }

    /* if variable is already defined then change its value */
    if (*vars && !lyxp_vars_find(NULL, *vars, name, 0, &item)) {
        var_value = strdup(value);
        LY_CHECK_RET(!var_value, LY_EMEM);

        /* update value */
        free(item->value);
        item->value = var_value;
    } else {
        var_name = strdup(name);
        var_value = strdup(value);
        LY_CHECK_ERR_GOTO(!var_name || !var_value, ret = LY_EMEM, error);

        /* add new variable */
        LY_ARRAY_NEW_GOTO(NULL, *vars, item, ret, error);
        item->name = var_name;
        item->value = var_value;
    }

    return LY_SUCCESS;

error:
    free(var_name);
    free(var_value);
    return ret;
}